

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::operator==(TreeEnsembleClassifier *a,TreeEnsembleClassifier *b)

{
  uint32 uVar1;
  bool bVar2;
  Int64Vector *a_00;
  Int64Vector *b_00;
  StringVector *a_01;
  StringVector *b_01;
  TreeEnsembleParameters *b_02;
  TreeEnsembleParameters *a_02;
  
  a_02 = a->treeensemble_;
  if (a_02 == (TreeEnsembleParameters *)0x0) {
    a_02 = (TreeEnsembleParameters *)&_TreeEnsembleParameters_default_instance_;
  }
  b_02 = b->treeensemble_;
  if (b_02 == (TreeEnsembleParameters *)0x0) {
    b_02 = (TreeEnsembleParameters *)&_TreeEnsembleParameters_default_instance_;
  }
  bVar2 = operator!=(a_02,b_02);
  if (((bVar2) || (a->postevaluationtransform_ != b->postevaluationtransform_)) ||
     (uVar1 = a->_oneof_case_[0], uVar1 != b->_oneof_case_[0])) {
    bVar2 = false;
  }
  else {
    if (uVar1 == 100) {
      a_01 = TreeEnsembleClassifier::stringclasslabels(a);
      b_01 = TreeEnsembleClassifier::stringclasslabels(b);
      bVar2 = vectorsEqual<CoreML::Specification::StringVector>(a_01,b_01);
      return bVar2;
    }
    bVar2 = true;
    if (uVar1 == 0x65) {
      a_00 = TreeEnsembleClassifier::int64classlabels(a);
      b_00 = TreeEnsembleClassifier::int64classlabels(b);
      bVar2 = vectorsEqual<CoreML::Specification::Int64Vector>(a_00,b_00);
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool operator==(const TreeEnsembleClassifier& a,
                        const TreeEnsembleClassifier& b) {
            if (a.treeensemble() != b.treeensemble()) {
                return false;
            }
            if (a.postevaluationtransform() != b.postevaluationtransform()) {
                return false;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case TreeEnsembleClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case TreeEnsembleClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case TreeEnsembleClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
            return true;
        }